

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_52317d::X509Test_SortRDN_Test::TestBody(X509Test_SortRDN_Test *this)

{
  bool bVar1;
  pointer pXVar2;
  char *pcVar3;
  char *in_R9;
  AssertHelper local_470;
  Message local_468;
  Bytes local_460;
  Span<const_unsigned_char> local_450;
  Bytes local_440;
  undefined1 local_430 [8];
  AssertionResult gtest_ar_1;
  UniquePtr<uint8_t> free_der;
  Message local_410;
  int local_404;
  undefined1 local_400 [8];
  AssertionResult gtest_ar;
  pointer puStack_3e8;
  int der_len;
  uint8_t *der;
  AssertHelper local_3c0;
  Message local_3b8;
  int local_3ac;
  undefined1 local_3a8 [8];
  AssertionResult gtest_ar__12;
  AssertHelper local_378;
  Message local_370;
  int local_364;
  undefined1 local_360 [8];
  AssertionResult gtest_ar__11;
  AssertHelper local_330;
  Message local_328;
  int local_31c;
  undefined1 local_318 [8];
  AssertionResult gtest_ar__10;
  AssertHelper local_2e8;
  Message local_2e0;
  int local_2d4;
  undefined1 local_2d0 [8];
  AssertionResult gtest_ar__9;
  AssertHelper local_2a0;
  Message local_298;
  int local_28c;
  undefined1 local_288 [8];
  AssertionResult gtest_ar__8;
  AssertHelper local_258;
  Message local_250;
  int local_244;
  undefined1 local_240 [8];
  AssertionResult gtest_ar__7;
  AssertHelper local_210;
  Message local_208;
  int local_1fc;
  undefined1 local_1f8 [8];
  AssertionResult gtest_ar__6;
  AssertHelper local_1c8;
  Message local_1c0;
  int local_1b4;
  undefined1 local_1b0 [8];
  AssertionResult gtest_ar__5;
  AssertHelper local_180;
  Message local_178;
  int local_16c;
  undefined1 local_168 [8];
  AssertionResult gtest_ar__4;
  AssertHelper local_138;
  Message local_130;
  int local_124;
  undefined1 local_120 [8];
  AssertionResult gtest_ar__3;
  AssertHelper local_f0;
  Message local_e8;
  int local_dc;
  undefined1 local_d8 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_a8;
  Message local_a0;
  int local_94;
  undefined1 local_90 [8];
  AssertionResult gtest_ar__1;
  anon_class_8_1_898f2789 append_entry_prev_rdn;
  anon_class_8_1_898f2789 append_entry_new_rdn;
  string local_68;
  AssertHelper local_48;
  Message local_40 [3];
  undefined1 local_28 [8];
  AssertionResult gtest_ar_;
  UniquePtr<X509_NAME> name;
  X509Test_SortRDN_Test *this_local;
  
  pXVar2 = (pointer)X509_NAME_new();
  std::unique_ptr<X509_name_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
            ((unique_ptr<X509_name_st,bssl::internal::Deleter> *)&gtest_ar_.message_,pXVar2);
  testing::AssertionResult::AssertionResult<std::unique_ptr<X509_name_st,bssl::internal::Deleter>>
            ((AssertionResult *)local_28,
             (unique_ptr<X509_name_st,_bssl::internal::Deleter> *)&gtest_ar_.message_,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_28);
  if (!bVar1) {
    testing::Message::Message(local_40);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_68,(internal *)local_28,(AssertionResult *)0x82fd02,"false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
               ,0x1b9c,pcVar3);
    testing::internal::AssertHelper::operator=(&local_48,local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    std::__cxx11::string::~string((string *)&local_68);
    testing::Message::~Message(local_40);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_28);
  if (bVar1) {
    gtest_ar__1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )&gtest_ar_.message_;
    append_entry_prev_rdn.name =
         (UniquePtr<X509_NAME> *)
         gtest_ar__1.message_._M_t.
         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         .
         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         ._M_head_impl;
    local_94 = TestBody::anon_class_8_1_898f2789::operator()(&append_entry_prev_rdn,"A");
    testing::AssertionResult::AssertionResult<int>
              ((AssertionResult *)local_90,&local_94,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_90);
    if (!bVar1) {
      testing::Message::Message(&local_a0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar__2.message_,(internal *)local_90,
                 (AssertionResult *)"append_entry_new_rdn(\"A\")","false","true",in_R9);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_a8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                 ,0x1baa,pcVar3);
      testing::internal::AssertHelper::operator=(&local_a8,&local_a0);
      testing::internal::AssertHelper::~AssertHelper(&local_a8);
      std::__cxx11::string::~string((string *)&gtest_ar__2.message_);
      testing::Message::~Message(&local_a0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_90);
    if (bVar1) {
      local_dc = TestBody::anon_class_8_1_898f2789::operator()
                           ((anon_class_8_1_898f2789 *)&gtest_ar__1.message_,"B");
      testing::AssertionResult::AssertionResult<int>
                ((AssertionResult *)local_d8,&local_dc,(type *)0x0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d8);
      if (!bVar1) {
        testing::Message::Message(&local_e8);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar__3.message_,(internal *)local_d8,
                   (AssertionResult *)"append_entry_prev_rdn(\"B\")","false","true",in_R9);
        pcVar3 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_f0,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                   ,0x1bab,pcVar3);
        testing::internal::AssertHelper::operator=(&local_f0,&local_e8);
        testing::internal::AssertHelper::~AssertHelper(&local_f0);
        std::__cxx11::string::~string((string *)&gtest_ar__3.message_);
        testing::Message::~Message(&local_e8);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_d8);
      if (bVar1) {
        local_124 = TestBody::anon_class_8_1_898f2789::operator()
                              ((anon_class_8_1_898f2789 *)&gtest_ar__1.message_,"AA");
        testing::AssertionResult::AssertionResult<int>
                  ((AssertionResult *)local_120,&local_124,(type *)0x0);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_120);
        if (!bVar1) {
          testing::Message::Message(&local_130);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar__4.message_,(internal *)local_120,
                     (AssertionResult *)"append_entry_prev_rdn(\"AA\")","false","true",in_R9);
          pcVar3 = (char *)std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (&local_138,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                     ,0x1bac,pcVar3);
          testing::internal::AssertHelper::operator=(&local_138,&local_130);
          testing::internal::AssertHelper::~AssertHelper(&local_138);
          std::__cxx11::string::~string((string *)&gtest_ar__4.message_);
          testing::Message::~Message(&local_130);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_120);
        if (bVar1) {
          local_16c = TestBody::anon_class_8_1_898f2789::operator()
                                ((anon_class_8_1_898f2789 *)&gtest_ar__1.message_,"AB");
          testing::AssertionResult::AssertionResult<int>
                    ((AssertionResult *)local_168,&local_16c,(type *)0x0);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_168);
          if (!bVar1) {
            testing::Message::Message(&local_178);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&gtest_ar__5.message_,(internal *)local_168,
                       (AssertionResult *)"append_entry_prev_rdn(\"AB\")","false","true",in_R9);
            pcVar3 = (char *)std::__cxx11::string::c_str();
            testing::internal::AssertHelper::AssertHelper
                      (&local_180,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                       ,0x1bad,pcVar3);
            testing::internal::AssertHelper::operator=(&local_180,&local_178);
            testing::internal::AssertHelper::~AssertHelper(&local_180);
            std::__cxx11::string::~string((string *)&gtest_ar__5.message_);
            testing::Message::~Message(&local_178);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_168);
          if (bVar1) {
            local_1b4 = TestBody::anon_class_8_1_898f2789::operator()(&append_entry_prev_rdn,"AB");
            testing::AssertionResult::AssertionResult<int>
                      ((AssertionResult *)local_1b0,&local_1b4,(type *)0x0);
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1b0);
            if (!bVar1) {
              testing::Message::Message(&local_1c0);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)&gtest_ar__6.message_,(internal *)local_1b0,
                         (AssertionResult *)"append_entry_new_rdn(\"AB\")","false","true",in_R9);
              pcVar3 = (char *)std::__cxx11::string::c_str();
              testing::internal::AssertHelper::AssertHelper
                        (&local_1c8,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                         ,0x1bb0,pcVar3);
              testing::internal::AssertHelper::operator=(&local_1c8,&local_1c0);
              testing::internal::AssertHelper::~AssertHelper(&local_1c8);
              std::__cxx11::string::~string((string *)&gtest_ar__6.message_);
              testing::Message::~Message(&local_1c0);
            }
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_1b0);
            if (bVar1) {
              local_1fc = TestBody::anon_class_8_1_898f2789::operator()
                                    ((anon_class_8_1_898f2789 *)&gtest_ar__1.message_,"AA");
              testing::AssertionResult::AssertionResult<int>
                        ((AssertionResult *)local_1f8,&local_1fc,(type *)0x0);
              bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1f8);
              if (!bVar1) {
                testing::Message::Message(&local_208);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)&gtest_ar__7.message_,(internal *)local_1f8,
                           (AssertionResult *)"append_entry_prev_rdn(\"AA\")","false","true",in_R9);
                pcVar3 = (char *)std::__cxx11::string::c_str();
                testing::internal::AssertHelper::AssertHelper
                          (&local_210,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                           ,0x1bb1,pcVar3);
                testing::internal::AssertHelper::operator=(&local_210,&local_208);
                testing::internal::AssertHelper::~AssertHelper(&local_210);
                std::__cxx11::string::~string((string *)&gtest_ar__7.message_);
                testing::Message::~Message(&local_208);
              }
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_1f8);
              if (bVar1) {
                local_244 = TestBody::anon_class_8_1_898f2789::operator()
                                      ((anon_class_8_1_898f2789 *)&gtest_ar__1.message_,"B");
                testing::AssertionResult::AssertionResult<int>
                          ((AssertionResult *)local_240,&local_244,(type *)0x0);
                bVar1 = testing::AssertionResult::operator_cast_to_bool
                                  ((AssertionResult *)local_240);
                if (!bVar1) {
                  testing::Message::Message(&local_250);
                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                            ((string *)&gtest_ar__8.message_,(internal *)local_240,
                             (AssertionResult *)"append_entry_prev_rdn(\"B\")","false","true",in_R9)
                  ;
                  pcVar3 = (char *)std::__cxx11::string::c_str();
                  testing::internal::AssertHelper::AssertHelper
                            (&local_258,kFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                             ,0x1bb2,pcVar3);
                  testing::internal::AssertHelper::operator=(&local_258,&local_250);
                  testing::internal::AssertHelper::~AssertHelper(&local_258);
                  std::__cxx11::string::~string((string *)&gtest_ar__8.message_);
                  testing::Message::~Message(&local_250);
                }
                testing::AssertionResult::~AssertionResult((AssertionResult *)local_240);
                if (bVar1) {
                  local_28c = TestBody::anon_class_8_1_898f2789::operator()
                                        ((anon_class_8_1_898f2789 *)&gtest_ar__1.message_,"A");
                  testing::AssertionResult::AssertionResult<int>
                            ((AssertionResult *)local_288,&local_28c,(type *)0x0);
                  bVar1 = testing::AssertionResult::operator_cast_to_bool
                                    ((AssertionResult *)local_288);
                  if (!bVar1) {
                    testing::Message::Message(&local_298);
                    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                              ((string *)&gtest_ar__9.message_,(internal *)local_288,
                               (AssertionResult *)"append_entry_prev_rdn(\"A\")","false","true",
                               in_R9);
                    pcVar3 = (char *)std::__cxx11::string::c_str();
                    testing::internal::AssertHelper::AssertHelper
                              (&local_2a0,kFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                               ,0x1bb3,pcVar3);
                    testing::internal::AssertHelper::operator=(&local_2a0,&local_298);
                    testing::internal::AssertHelper::~AssertHelper(&local_2a0);
                    std::__cxx11::string::~string((string *)&gtest_ar__9.message_);
                    testing::Message::~Message(&local_298);
                  }
                  testing::AssertionResult::~AssertionResult((AssertionResult *)local_288);
                  if (bVar1) {
                    local_2d4 = TestBody::anon_class_8_1_898f2789::operator()
                                          (&append_entry_prev_rdn,"A");
                    testing::AssertionResult::AssertionResult<int>
                              ((AssertionResult *)local_2d0,&local_2d4,(type *)0x0);
                    bVar1 = testing::AssertionResult::operator_cast_to_bool
                                      ((AssertionResult *)local_2d0);
                    if (!bVar1) {
                      testing::Message::Message(&local_2e0);
                      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                ((string *)&gtest_ar__10.message_,(internal *)local_2d0,
                                 (AssertionResult *)"append_entry_new_rdn(\"A\")","false","true",
                                 in_R9);
                      pcVar3 = (char *)std::__cxx11::string::c_str();
                      testing::internal::AssertHelper::AssertHelper
                                (&local_2e8,kFatalFailure,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                                 ,0x1bb6,pcVar3);
                      testing::internal::AssertHelper::operator=(&local_2e8,&local_2e0);
                      testing::internal::AssertHelper::~AssertHelper(&local_2e8);
                      std::__cxx11::string::~string((string *)&gtest_ar__10.message_);
                      testing::Message::~Message(&local_2e0);
                    }
                    testing::AssertionResult::~AssertionResult((AssertionResult *)local_2d0);
                    if (bVar1) {
                      local_31c = TestBody::anon_class_8_1_898f2789::operator()
                                            ((anon_class_8_1_898f2789 *)&gtest_ar__1.message_,"AA");
                      testing::AssertionResult::AssertionResult<int>
                                ((AssertionResult *)local_318,&local_31c,(type *)0x0);
                      bVar1 = testing::AssertionResult::operator_cast_to_bool
                                        ((AssertionResult *)local_318);
                      if (!bVar1) {
                        testing::Message::Message(&local_328);
                        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                  ((string *)&gtest_ar__11.message_,(internal *)local_318,
                                   (AssertionResult *)"append_entry_prev_rdn(\"AA\")","false","true"
                                   ,in_R9);
                        pcVar3 = (char *)std::__cxx11::string::c_str();
                        testing::internal::AssertHelper::AssertHelper
                                  (&local_330,kFatalFailure,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                                   ,0x1bb7,pcVar3);
                        testing::internal::AssertHelper::operator=(&local_330,&local_328);
                        testing::internal::AssertHelper::~AssertHelper(&local_330);
                        std::__cxx11::string::~string((string *)&gtest_ar__11.message_);
                        testing::Message::~Message(&local_328);
                      }
                      testing::AssertionResult::~AssertionResult((AssertionResult *)local_318);
                      if (bVar1) {
                        local_364 = TestBody::anon_class_8_1_898f2789::operator()
                                              ((anon_class_8_1_898f2789 *)&gtest_ar__1.message_,"B")
                        ;
                        testing::AssertionResult::AssertionResult<int>
                                  ((AssertionResult *)local_360,&local_364,(type *)0x0);
                        bVar1 = testing::AssertionResult::operator_cast_to_bool
                                          ((AssertionResult *)local_360);
                        if (!bVar1) {
                          testing::Message::Message(&local_370);
                          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                    ((string *)&gtest_ar__12.message_,(internal *)local_360,
                                     (AssertionResult *)"append_entry_prev_rdn(\"B\")","false",
                                     "true",in_R9);
                          pcVar3 = (char *)std::__cxx11::string::c_str();
                          testing::internal::AssertHelper::AssertHelper
                                    (&local_378,kFatalFailure,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                                     ,0x1bb8,pcVar3);
                          testing::internal::AssertHelper::operator=(&local_378,&local_370);
                          testing::internal::AssertHelper::~AssertHelper(&local_378);
                          std::__cxx11::string::~string((string *)&gtest_ar__12.message_);
                          testing::Message::~Message(&local_370);
                        }
                        testing::AssertionResult::~AssertionResult((AssertionResult *)local_360);
                        if (bVar1) {
                          local_3ac = TestBody::anon_class_8_1_898f2789::operator()
                                                ((anon_class_8_1_898f2789 *)&gtest_ar__1.message_,
                                                 "AB");
                          testing::AssertionResult::AssertionResult<int>
                                    ((AssertionResult *)local_3a8,&local_3ac,(type *)0x0);
                          bVar1 = testing::AssertionResult::operator_cast_to_bool
                                            ((AssertionResult *)local_3a8);
                          if (!bVar1) {
                            testing::Message::Message(&local_3b8);
                            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                      ((string *)&der,(internal *)local_3a8,
                                       (AssertionResult *)"append_entry_prev_rdn(\"AB\")","false",
                                       "true",in_R9);
                            pcVar3 = (char *)std::__cxx11::string::c_str();
                            testing::internal::AssertHelper::AssertHelper
                                      (&local_3c0,kFatalFailure,
                                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                                       ,0x1bb9,pcVar3);
                            testing::internal::AssertHelper::operator=(&local_3c0,&local_3b8);
                            testing::internal::AssertHelper::~AssertHelper(&local_3c0);
                            std::__cxx11::string::~string((string *)&der);
                            testing::Message::~Message(&local_3b8);
                          }
                          testing::AssertionResult::~AssertionResult((AssertionResult *)local_3a8);
                          if (bVar1) {
                            puStack_3e8 = (pointer)0x0;
                            pXVar2 = std::unique_ptr<X509_name_st,_bssl::internal::Deleter>::get
                                               ((unique_ptr<X509_name_st,_bssl::internal::Deleter> *
                                                )&gtest_ar_.message_);
                            gtest_ar.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl._4_4_ =
                                 i2d_X509_NAME((X509_NAME *)pXVar2,&stack0xfffffffffffffc18);
                            local_404 = 0;
                            testing::internal::CmpHelperGT<int,int>
                                      ((internal *)local_400,"der_len","0",
                                       (int *)((long)&gtest_ar.message_._M_t.
                                                                                                            
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                              + 4),&local_404);
                            bVar1 = testing::AssertionResult::operator_cast_to_bool
                                              ((AssertionResult *)local_400);
                            if (!bVar1) {
                              testing::Message::Message(&local_410);
                              pcVar3 = testing::AssertionResult::failure_message
                                                 ((AssertionResult *)local_400);
                              testing::internal::AssertHelper::AssertHelper
                                        ((AssertHelper *)&free_der,kFatalFailure,
                                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                                         ,0x1bbd,pcVar3);
                              testing::internal::AssertHelper::operator=
                                        ((AssertHelper *)&free_der,&local_410);
                              testing::internal::AssertHelper::~AssertHelper
                                        ((AssertHelper *)&free_der);
                              testing::Message::~Message(&local_410);
                            }
                            testing::AssertionResult::~AssertionResult((AssertionResult *)local_400)
                            ;
                            if (bVar1) {
                              std::unique_ptr<unsigned_char,bssl::internal::Deleter>::
                              unique_ptr<bssl::internal::Deleter,void>
                                        ((unique_ptr<unsigned_char,bssl::internal::Deleter> *)
                                         &gtest_ar_1.message_,puStack_3e8);
                              bssl::Span<unsigned_char_const>::Span<135ul>
                                        ((Span<unsigned_char_const> *)&local_450,
                                         &TestBody::kExpected);
                              Bytes::Bytes(&local_440,local_450);
                              Bytes::Bytes(&local_460,puStack_3e8,
                                           (long)gtest_ar.message_._M_t.
                                                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 ._M_t.
                                                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 .
                                                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                 ._M_head_impl._4_4_);
                              testing::internal::EqHelper::Compare<Bytes,_Bytes,_nullptr>
                                        ((EqHelper *)local_430,"Bytes(kExpected)",
                                         "Bytes(der, der_len)",&local_440,&local_460);
                              bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                ((AssertionResult *)local_430);
                              if (!bVar1) {
                                testing::Message::Message(&local_468);
                                pcVar3 = testing::AssertionResult::failure_message
                                                   ((AssertionResult *)local_430);
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_470,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                                           ,0x1be6,pcVar3);
                                testing::internal::AssertHelper::operator=(&local_470,&local_468);
                                testing::internal::AssertHelper::~AssertHelper(&local_470);
                                testing::Message::~Message(&local_468);
                              }
                              testing::AssertionResult::~AssertionResult
                                        ((AssertionResult *)local_430);
                              std::unique_ptr<unsigned_char,_bssl::internal::Deleter>::~unique_ptr
                                        ((unique_ptr<unsigned_char,_bssl::internal::Deleter> *)
                                         &gtest_ar_1.message_);
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  std::unique_ptr<X509_name_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<X509_name_st,_bssl::internal::Deleter> *)&gtest_ar_.message_);
  return;
}

Assistant:

TEST(X509Test, SortRDN) {
  bssl::UniquePtr<X509_NAME> name(X509_NAME_new());
  ASSERT_TRUE(name);

  auto append_entry_new_rdn = [&](const char *str) {
    return X509_NAME_add_entry_by_NID(name.get(), NID_commonName, MBSTRING_ASC,
                                      reinterpret_cast<const uint8_t *>(str),
                                      strlen(str), /*loc=*/-1, /*set=*/0);
  };
  auto append_entry_prev_rdn = [&](const char *str) {
    return X509_NAME_add_entry_by_NID(name.get(), NID_commonName, MBSTRING_ASC,
                                      reinterpret_cast<const uint8_t *>(str),
                                      strlen(str), /*loc=*/-1, /*set=*/-1);
  };

  // This is the sort order to expect.
  ASSERT_TRUE(append_entry_new_rdn("A"));
  ASSERT_TRUE(append_entry_prev_rdn("B"));
  ASSERT_TRUE(append_entry_prev_rdn("AA"));
  ASSERT_TRUE(append_entry_prev_rdn("AB"));

  // The same RDN, with entries added in a different order.
  ASSERT_TRUE(append_entry_new_rdn("AB"));
  ASSERT_TRUE(append_entry_prev_rdn("AA"));
  ASSERT_TRUE(append_entry_prev_rdn("B"));
  ASSERT_TRUE(append_entry_prev_rdn("A"));

  // The same RDN, with entries added in a different order.
  ASSERT_TRUE(append_entry_new_rdn("A"));
  ASSERT_TRUE(append_entry_prev_rdn("AA"));
  ASSERT_TRUE(append_entry_prev_rdn("B"));
  ASSERT_TRUE(append_entry_prev_rdn("AB"));

  uint8_t *der = nullptr;
  int der_len = i2d_X509_NAME(name.get(), &der);
  ASSERT_GT(der_len, 0);
  bssl::UniquePtr<uint8_t> free_der(der);

  // SEQUENCE {
  //   SET {
  //     SEQUENCE {
  //       # commonName
  //       OBJECT_IDENTIFIER { 2.5.4.3 }
  //       UTF8String { "A" }
  //     }
  //     SEQUENCE {
  //       # commonName
  //       OBJECT_IDENTIFIER { 2.5.4.3 }
  //       UTF8String { "B" }
  //     }
  //     SEQUENCE {
  //       # commonName
  //       OBJECT_IDENTIFIER { 2.5.4.3 }
  //       UTF8String { "AA" }
  //     }
  //     SEQUENCE {
  //       # commonName
  //       OBJECT_IDENTIFIER { 2.5.4.3 }
  //       UTF8String { "AB" }
  //     }
  //   }
  //   ...two more copies of the above SET...
  // }
  static uint8_t kExpected[] = {
      0x30, 0x81, 0x84, 0x31, 0x2a, 0x30, 0x08, 0x06, 0x03, 0x55, 0x04, 0x03,
      0x0c, 0x01, 0x41, 0x30, 0x08, 0x06, 0x03, 0x55, 0x04, 0x03, 0x0c, 0x01,
      0x42, 0x30, 0x09, 0x06, 0x03, 0x55, 0x04, 0x03, 0x0c, 0x02, 0x41, 0x41,
      0x30, 0x09, 0x06, 0x03, 0x55, 0x04, 0x03, 0x0c, 0x02, 0x41, 0x42, 0x31,
      0x2a, 0x30, 0x08, 0x06, 0x03, 0x55, 0x04, 0x03, 0x0c, 0x01, 0x41, 0x30,
      0x08, 0x06, 0x03, 0x55, 0x04, 0x03, 0x0c, 0x01, 0x42, 0x30, 0x09, 0x06,
      0x03, 0x55, 0x04, 0x03, 0x0c, 0x02, 0x41, 0x41, 0x30, 0x09, 0x06, 0x03,
      0x55, 0x04, 0x03, 0x0c, 0x02, 0x41, 0x42, 0x31, 0x2a, 0x30, 0x08, 0x06,
      0x03, 0x55, 0x04, 0x03, 0x0c, 0x01, 0x41, 0x30, 0x08, 0x06, 0x03, 0x55,
      0x04, 0x03, 0x0c, 0x01, 0x42, 0x30, 0x09, 0x06, 0x03, 0x55, 0x04, 0x03,
      0x0c, 0x02, 0x41, 0x41, 0x30, 0x09, 0x06, 0x03, 0x55, 0x04, 0x03, 0x0c,
      0x02, 0x41, 0x42};
  EXPECT_EQ(Bytes(kExpected), Bytes(der, der_len));
}